

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86.cpp
# Opt level: O2

int __thiscall ncnn::ELU_x86::forward_inplace(ELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  _func_int *p_Var5;
  ulong uVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
  uVar12 = 0;
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar12;
  }
  pp_Var1 = this->_vptr_ELU_x86;
  for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar8 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
    fVar13 = *(float *)(&this->field_0xd0 + (long)pp_Var1[-3]);
    lVar9 = 0;
    for (iVar11 = 0; iVar11 + 3 < iVar10; iVar11 = iVar11 + 4) {
      auVar22 = minps(*pauVar8,ZEXT816(0));
      auVar23._8_4_ = 0x42b0c0a5;
      auVar23._0_8_ = 0x42b0c0a542b0c0a5;
      auVar23._12_4_ = 0x42b0c0a5;
      auVar23 = minps(auVar22,auVar23);
      auVar22._8_4_ = 0xc2b0c0a5;
      auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar22._12_4_ = 0xc2b0c0a5;
      auVar23 = maxps(auVar23,auVar22);
      fVar18 = auVar23._0_4_ * 1.442695 + 0.5;
      fVar19 = auVar23._4_4_ * 1.442695 + 0.5;
      fVar20 = auVar23._8_4_ * 1.442695 + 0.5;
      fVar21 = auVar23._12_4_ * 1.442695 + 0.5;
      fVar14 = (float)(int)fVar18;
      fVar15 = (float)(int)fVar19;
      fVar16 = (float)(int)fVar20;
      fVar17 = (float)(int)fVar21;
      fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
      fVar15 = fVar15 - (float)(-(uint)(fVar19 < fVar15) & 0x3f800000);
      fVar16 = fVar16 - (float)(-(uint)(fVar20 < fVar16) & 0x3f800000);
      fVar17 = fVar17 - (float)(-(uint)(fVar21 < fVar17) & 0x3f800000);
      fVar18 = fVar14 * -0.6931472 + auVar23._0_4_;
      fVar19 = fVar15 * -0.6931472 + auVar23._4_4_;
      fVar20 = fVar16 * -0.6931472 + auVar23._8_4_;
      fVar21 = fVar17 * -0.6931472 + auVar23._12_4_;
      auVar23 = maxps(*pauVar8,ZEXT816(0));
      *(float *)*pauVar8 =
           ((float)((int)fVar14 * 0x800000 + 0x3f800000) *
            (fVar18 + 1.0 +
            (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
              0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + -1.0) *
           fVar13 + auVar23._0_4_;
      *(float *)(*pauVar8 + 4) =
           ((float)((int)fVar15 * 0x800000 + 0x3f800000) *
            (fVar19 + 1.0 +
            (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
              0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + -1.0) *
           fVar13 + auVar23._4_4_;
      *(float *)(*pauVar8 + 8) =
           ((float)((int)fVar16 * 0x800000 + 0x3f800000) *
            (fVar20 + 1.0 +
            (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
              0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5) * fVar20 * fVar20) + -1.0) *
           fVar13 + auVar23._8_4_;
      *(float *)(*pauVar8 + 0xc) =
           ((float)((int)fVar17 * 0x800000 + 0x3f800000) *
            (fVar21 + 1.0 +
            (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
              0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * fVar21 * fVar21) + -1.0) *
           fVar13 + auVar23._12_4_;
      pauVar8 = pauVar8 + 1;
      lVar9 = lVar9 + 4;
    }
    lVar7 = sVar4 * sVar3 * uVar12;
    for (; (int)lVar9 < iVar10; lVar9 = lVar9 + 1) {
      fVar13 = *(float *)((long)pvVar2 + lVar9 * 4 + lVar7);
      if (fVar13 < 0.0) {
        p_Var5 = pp_Var1[-3];
        fVar13 = expf(fVar13);
        *(float *)((long)pvVar2 + lVar9 * 4 + lVar7) =
             (fVar13 + -1.0) * *(float *)(&this->field_0xd0 + (long)p_Var5);
      }
    }
  }
  return 0;
}

Assistant:

int ELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}